

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O2

int mriStep_NlsLSetup(int jbad,int *jcur,void *arkode_mem)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_NlsLSetup",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (jbad == 0) {
      iVar1 = step_mem->convfail;
    }
    else {
      step_mem->convfail = 1;
      iVar1 = 1;
    }
    step_mem->nsetups = step_mem->nsetups + 1;
    iVar1 = (*step_mem->lsetup)(ark_mem,iVar1,ark_mem->tcur,ark_mem->ycur,
                                step_mem->Fsi[step_mem->stage_map[step_mem->istage]],&step_mem->jcur
                                ,ark_mem->tempv1,ark_mem->tempv2,ark_mem->tempv3);
    *jcur = step_mem->jcur;
    ark_mem->firststage = 0;
    step_mem->crate = 1.0;
    step_mem->gamrat = 1.0;
    step_mem->gammap = step_mem->gamma;
    step_mem->nstlp = ark_mem->nst;
    if (iVar1 < 0) {
      iVar1 = -6;
    }
    else {
      iVar1 = (uint)(iVar1 != 0) << 2;
    }
  }
  return iVar1;
}

Assistant:

int mriStep_NlsLSetup(booleantype jbad, booleantype* jcur, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_NlsLSetup",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update convfail based on jbad flag */
  if (jbad)  step_mem->convfail = ARK_FAIL_BAD_J;

  /* Use ARKode's tempv1, tempv2 and tempv3 as
     temporary vectors for the linear solver setup routine */
  step_mem->nsetups++;
  retval = step_mem->lsetup(ark_mem, step_mem->convfail, ark_mem->tcur,
                            ark_mem->ycur,
                            step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                            &(step_mem->jcur), ark_mem->tempv1,
                            ark_mem->tempv2, ark_mem->tempv3);

  /* update Jacobian status */
  *jcur = step_mem->jcur;

  /* update flags and 'gamma' values for last lsetup call */
  ark_mem->firststage = SUNFALSE;
  step_mem->gamrat = step_mem->crate = ONE;
  step_mem->gammap = step_mem->gamma;
  step_mem->nstlp  = ark_mem->nst;

  if (retval < 0) return(ARK_LSETUP_FAIL);
  if (retval > 0) return(CONV_FAIL);

  return(ARK_SUCCESS);
}